

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O3

void tcg_gen_dup16i_vec_mips64(TCGContext_conflict5 *tcg_ctx,TCGv_vec r,uint32_t a)

{
  uint uVar1;
  TCGOp *pTVar2;
  
  uVar1 = *(uint *)(r + (long)&tcg_ctx->pool_cur);
  pTVar2 = tcg_emit_op_mips64(tcg_ctx,INDEX_op_dupi_vec);
  *(uint *)pTVar2 = (*(uint *)pTVar2 & 0xffff00ff) + ((uVar1 >> 8) + 0xe00 & 0xf00) + 0x3000;
  pTVar2->args[0] = (TCGArg)(r + (long)&tcg_ctx->pool_cur);
  pTVar2->args[1] = (ulong)(a & 0xffff) * 0x1000100010001;
  return;
}

Assistant:

void tcg_gen_dup16i_vec(TCGContext *tcg_ctx, TCGv_vec r, uint32_t a)
{
    do_dupi_vec(tcg_ctx, r, MO_REG, dup_const(MO_16, a));
}